

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

Expression ** __thiscall
wasm::DataFlowOpts::getIndexPointer(DataFlowOpts *this,Expression *expr,Index index)

{
  Id IVar1;
  long lVar2;
  
  IVar1 = expr->_id;
  if (IVar1 == SelectId) {
    if (2 < index) {
      handle_unreachable("unexpected index",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                         ,0xf9);
    }
    lVar2 = *(long *)(&DAT_00b5ebe0 + (ulong)index * 8);
  }
  else if (IVar1 == BinaryId) {
    lVar2 = 0x18;
    if (index != 0) {
      if (index != 1) {
        handle_unreachable("unexpected index",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                           ,0xf0);
      }
      lVar2 = 0x20;
    }
  }
  else {
    if (IVar1 != UnaryId) {
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                         ,0xfb);
    }
    lVar2 = 0x18;
    if (index != 0) {
      __assert_fail("index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                    ,0xe8,"Expression **wasm::DataFlowOpts::getIndexPointer(Expression *, Index)");
    }
  }
  return (Expression **)((long)&expr->_id + lVar2);
}

Assistant:

Expression** getIndexPointer(Expression* expr, Index index) {
    if (auto* unary = expr->dynCast<Unary>()) {
      assert(index == 0);
      return &unary->value;
    } else if (auto* binary = expr->dynCast<Binary>()) {
      if (index == 0) {
        return &binary->left;
      } else if (index == 1) {
        return &binary->right;
      }
      WASM_UNREACHABLE("unexpected index");
    } else if (auto* select = expr->dynCast<Select>()) {
      if (index == 0) {
        return &select->condition;
      } else if (index == 1) {
        return &select->ifTrue;
      } else if (index == 2) {
        return &select->ifFalse;
      }
      WASM_UNREACHABLE("unexpected index");
    }
    WASM_UNREACHABLE("unexpected expression type");
  }